

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O0

void __thiscall ncnn::Yolov3Detection::~Yolov3Detection(Yolov3Detection *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__Yolov3Detection_001d8c60;
  if (in_RDI[0x1c] != 0) {
    if ((long *)in_RDI[0x1c] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[0x1c] + 8))();
    }
    in_RDI[0x1c] = 0;
  }
  if (in_RDI[0x1d] != 0) {
    in_stack_ffffffffffffffe0 = (Layer *)in_RDI[0x1d];
    if (in_stack_ffffffffffffffe0 != (Layer *)0x0) {
      (*in_stack_ffffffffffffffe0->_vptr_Layer[1])();
    }
    in_RDI[0x1d] = 0;
  }
  Mat::~Mat((Mat *)0x1ab8b1);
  Layer::~Layer(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

Yolov3Detection::~Yolov3Detection()
{
    if (NULL != softmax)
    {
        delete softmax;
        softmax = NULL;
    }

    if (NULL != sigmoid)
    {
        delete sigmoid;
        sigmoid = NULL;
    }
}